

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptNativeFloatArray *
Js::JavascriptNativeIntArray::ToNativeFloatArray(JavascriptNativeIntArray *intArray)

{
  Type *this;
  uint32 left;
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  InterruptPoller *pIVar3;
  Recycler *recycler;
  SparseArraySegmentBase *nextSeg;
  DynamicType *pDVar4;
  JavascriptLibrary *pJVar5;
  DynamicTypeHandler *pDVar6;
  FinalizableObject FVar7;
  code *pcVar8;
  bool bVar9;
  BOOL BVar10;
  uint sourceContextId;
  LocalFunctionId functionId;
  uint uVar11;
  int iVar12;
  JavascriptFunction *pJVar13;
  undefined4 *puVar14;
  FunctionBody *pFVar15;
  SparseArraySegmentBase *segment;
  SparseArraySegmentBase *pSVar16;
  SegmentBTreeRoot *this_00;
  INT_PTR *pIVar17;
  SparseArraySegmentBase *this_01;
  double dVar18;
  undefined1 local_118 [8];
  AutoDisableInterrupt failFastError;
  JavascriptFunction *local_48;
  JavascriptFunction *caller;
  bool local_31;
  
  pSVar1 = (((((intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
               super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  pTVar2 = pSVar1->threadContext;
  local_31 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  pJVar13 = (JavascriptFunction *)
            JavascriptNativeArray::GetArrayCallSiteInfo(&intArray->super_JavascriptNativeArray);
  this = &(intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
          super_DynamicObject.super_RecyclableObject.type;
  if (pJVar13 != (JavascriptFunction *)0x0) {
    caller = pJVar13;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_118,
               (((this->ptr->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
               ,true,(PVOID)0x0,false);
    local_48 = (JavascriptFunction *)0x0;
    do {
      BVar10 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_118,&local_48,true);
      if (BVar10 == 0) {
        bVar9 = Phases::IsEnabled((Phases *)&DAT_01453738,NativeArrayConversionPhase);
        pJVar13 = caller;
        if (!bVar9) goto LAB_00a422d3;
        Output::Print(L"Conversion: Int array to Float array across ScriptContexts");
        goto LAB_00a422ce;
      }
    } while ((local_48 == (JavascriptFunction *)0x0) ||
            (BVar10 = JavascriptFunction::IsScriptFunction(local_48), pJVar13 = caller, BVar10 == 0)
            );
    if (local_48 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x68d,"(caller)","caller");
      if (!bVar9) goto LAB_00a426e8;
      *puVar14 = 0;
    }
    pFVar15 = JavascriptFunction::GetFunctionBody(local_48);
    if (pFVar15 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x68e,"(caller->GetFunctionBody())","caller->GetFunctionBody()");
      if (!bVar9) goto LAB_00a426e8;
      *puVar14 = 0;
    }
    pFVar15 = JavascriptFunction::GetFunctionBody(local_48);
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar15);
    pFVar15 = JavascriptFunction::GetFunctionBody(local_48);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar15);
    bVar9 = Phases::IsEnabled((Phases *)&DAT_01453738,NativeArrayConversionPhase,sourceContextId,
                              functionId);
    if (bVar9) {
      Output::Print(L"Conversion: Int array to Float array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                    ,(ulong)*(uint *)((long)&(pJVar13->super_DynamicObject).super_RecyclableObject.
                                             super_FinalizableObject.super_IRecyclerVisitedObject.
                                             _vptr_IRecyclerVisitedObject + 4),
                    (ulong)*(ushort *)
                            &(pJVar13->super_DynamicObject).super_RecyclableObject.type.ptr);
LAB_00a422ce:
      Output::Flush();
    }
LAB_00a422d3:
    ArrayCallSiteInfo::SetIsNotNativeIntArray((ArrayCallSiteInfo *)pJVar13);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_118);
  }
  local_118 = (undefined1  [8])pSVar1->threadContext;
  failFastError.m_threadContext._0_2_ = 0;
  failFastError.m_threadContext._2_1_ = 1;
  pIVar3 = ((ThreadContext *)local_118)->interruptPoller;
  if (pIVar3 != (InterruptPoller *)0x0) {
    failFastError.m_threadContext._0_2_ = (ushort)pIVar3->isDisabled << 8;
    pIVar3->isDisabled = true;
  }
  recycler = pSVar1->recycler;
  nextSeg = (intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  caller = (JavascriptFunction *)__tls_get_addr(&PTR_013e5f18);
  pSVar16 = (SparseArraySegmentBase *)0x0;
  while (this_01 = nextSeg, this_01 != (SparseArraySegmentBase *)0x0) {
    nextSeg = (this_01->next).ptr;
    if (this_01->size != 0) {
      left = this_01->left;
      if ((this_01 == (intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr) ||
         (uVar11 = this_01->size >> 2, uVar11 < this_01->length)) {
        segment = &SparseArraySegment<double>::AllocateSegment
                             (recycler,left,this_01->length,nextSeg)->super_SparseArraySegmentBase;
        if (segment == (SparseArraySegmentBase *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)
           &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x6c5,"(newSeg != nullptr)","newSeg != nullptr");
          if (!bVar9) goto LAB_00a426e8;
          *(undefined4 *)
           &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
        }
        if ((this_01 != (intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr) ==
            (pSVar16 == (SparseArraySegmentBase *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)
           &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x6c6,"((prevSeg == nullptr) == (seg == intArray->head))",
                                      "(prevSeg == nullptr) == (seg == intArray->head)");
          if (!bVar9) goto LAB_00a426e8;
          *(undefined4 *)
           &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
        }
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(&segment->next,nextSeg)
        ;
        JavascriptArray::LinkSegments<double>
                  ((JavascriptArray *)intArray,(SparseArraySegment<double> *)pSVar16,
                   (SparseArraySegment<double> *)segment);
        pSVar16 = JavascriptArray::GetLastUsedSegment((JavascriptArray *)intArray);
        if (pSVar16 == this_01) {
          JavascriptArray::SetLastUsedSegment((JavascriptArray *)intArray,segment);
        }
        this_00 = JavascriptArray::GetSegmentMap((JavascriptArray *)intArray);
        if (this_00 != (SegmentBTreeRoot *)0x0) {
          SegmentBTree::SwapSegment(&this_00->super_SegmentBTree,left,this_01,segment);
        }
        for (uVar11 = 0; pSVar16 = segment, uVar11 < segment->length; uVar11 = uVar11 + 1) {
          if ((&this_01[1].left)[(int)uVar11] == 0xfff80002) {
            if ((segment == (intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr)
               && (bVar9 = JavascriptArray::HasNoMissingValues((JavascriptArray *)intArray), bVar9))
            {
              if ((segment == (intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr
                  ) && (bVar9 = JavascriptArray::HasNoMissingValues((JavascriptArray *)intArray),
                       bVar9)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)
                 &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
                bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                            ,0x6da,
                                            "((newSeg != intArray->head || !intArray->HasNoMissingValues()))"
                                            ,"Unexpected missing item during array conversion");
                if (!bVar9) goto LAB_00a426e8;
                *(undefined4 *)
                 &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
              }
              Throw::FatalInternalError(-0x7fffbffb);
            }
          }
          else {
            *(double *)(&segment[1].left + (long)(int)uVar11 * 2) =
                 (double)(int)(&this_01[1].left)[(int)uVar11];
          }
        }
      }
      else {
        this_01->size = uVar11;
        SparseArraySegmentBase::CheckLengthvsSize(this_01);
        uVar11 = this_01->length;
        while (uVar11 = uVar11 - 1, pSVar16 = this_01, -1 < (int)uVar11) {
          dVar18 = JavascriptNativeFloatArray::MissingItem;
          if ((&this_01[1].left)[uVar11 & 0x7fffffff] != 0xfff80002) {
            dVar18 = (double)(int)(&this_01[1].left)[uVar11 & 0x7fffffff];
          }
          *(double *)(&this_01[1].left + (ulong)(uVar11 & 0x7fffffff) * 2) = dVar18;
        }
      }
    }
  }
  pDVar4 = (DynamicType *)this->ptr;
  pJVar5 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (pDVar4 == (pJVar5->nativeIntArrayType).ptr) {
    Memory::WriteBarrierPtr<Js::Type>::WriteBarrierSet
              (this,&((pJVar5->nativeFloatArrayType).ptr)->super_Type);
  }
  else {
    if (pDVar4->isLocked == true) {
      pDVar6 = (pDVar4->typeHandler).ptr;
      iVar12 = (*pDVar6->_vptr_DynamicTypeHandler[0x4e])(pDVar6);
      if (iVar12 == 0) {
        DynamicObject::ChangeType((DynamicObject *)intArray);
      }
      else {
        (*pDVar6->_vptr_DynamicTypeHandler[0x4a])(pDVar6,intArray);
      }
    }
    this->ptr->typeId = TypeIds_ArrayLast;
  }
  BVar10 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptNativeIntArray>(intArray);
  FVar7.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
       super_IRecyclerVisitedObject;
  if (BVar10 == 0) {
    if (FVar7.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
        (IRecyclerVisitedObject)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address) {
      pIVar17 = &VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
      goto LAB_00a42652;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)
     &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x716,
                                "(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray))"
                                ,
                                "VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray)"
                               );
    if (!bVar9) goto LAB_00a426e8;
    pIVar17 = &VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
  }
  else {
    if (FVar7.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
        (IRecyclerVisitedObject)
        VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address) {
      pIVar17 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
      goto LAB_00a42652;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)
     &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x711,
                                "(VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray))"
                                ,
                                "VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray)"
                               );
    if (!bVar9) {
LAB_00a426e8:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    pIVar17 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
  }
  *(undefined4 *)
   &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
LAB_00a42652:
  (intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
  super_DynamicObject.super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)((IRecyclerVisitedObject *)pIVar17)->_vptr_IRecyclerVisitedObject;
  failFastError.m_threadContext._0_1_ = 1;
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_118);
  pTVar2->noJsReentrancy = local_31;
  return (JavascriptNativeFloatArray *)intArray;
}

Assistant:

JavascriptNativeFloatArray *JavascriptNativeIntArray::ToNativeFloatArray(JavascriptNativeIntArray *intArray)
    {
        ScriptContext *scriptContext = intArray->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(IntArr_ToNativeFloatArray, reentrancylock, scriptContext->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = intArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(intArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Int array to Float array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Int array to Float array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Int array to Float array"));
                Output::Flush();
            }
#endif

            arrayInfo->SetIsNotNativeIntArray();
        }
#endif


        // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
        AutoDisableInterrupt failFastError(scriptContext->GetThreadContext());

        // Grow the segments
        Recycler *recycler = scriptContext->GetRecycler();
        SparseArraySegmentBase *seg, *nextSeg, *prevSeg = nullptr;
        for (seg = intArray->head; seg; seg = nextSeg)
        {
            nextSeg = seg->next;
            uint32 size = seg->size;
            if (size == 0)
            {
                continue;
            }

            uint32 left = seg->left;
            uint32 length = seg->length;
            int i;
            int32 ival;

            // The old segment will have size/2 and length capped by the new size.
            uint32 newSegSize = seg->size >> 1;
            if (seg == intArray->head || seg->length > (newSegSize >> 1))
            {
                // Some live elements are being pushed out of this segment, so allocate a new one.
                SparseArraySegment<double> *newSeg =
                    SparseArraySegment<double>::AllocateSegment(recycler, left, length, nextSeg);
                Assert(newSeg != nullptr);
                Assert((prevSeg == nullptr) == (seg == intArray->head));
                newSeg->next = nextSeg;
                intArray->LinkSegments((SparseArraySegment<double>*)prevSeg, newSeg);
                if (intArray->GetLastUsedSegment() == seg)
                {
                    intArray->SetLastUsedSegment(newSeg);
                }
                prevSeg = newSeg;
                SegmentBTree * segmentMap = intArray->GetSegmentMap();
                if (segmentMap)
                {
                    segmentMap->SwapSegment(left, seg, newSeg);
                }

                // Fill the new segment with the overflow.
                for (i = 0; (uint)i < newSeg->length; i++)
                {
                    ival = ((SparseArraySegment<int32>*)seg)->elements[i /*+ seg->length*/];
                    if (ival == JavascriptNativeIntArray::MissingItem)
                    {
                        AssertMsgAndFailFast(newSeg != intArray->head || !intArray->HasNoMissingValues(), "Unexpected missing item during array conversion");
                        continue;
                    }
                    newSeg->elements[i] = (double)ival;
                }
            }
            else
            {
                seg->size = newSegSize >> 1;
                seg->CheckLengthvsSize();

                // Now convert the contents that will remain in the old segment.
                for (i = seg->length - 1; i >= 0; i--)
                {
                    ival = ((SparseArraySegment<int32>*)seg)->elements[i];
                    if (ival == JavascriptNativeIntArray::MissingItem)
                    {
                        ((SparseArraySegment<double>*)seg)->elements[i] = (double)JavascriptNativeFloatArray::MissingItem;
                    }
                    else
                    {
                        ((SparseArraySegment<double>*)seg)->elements[i] = (double)ival;
                    }
                }
                prevSeg = seg;
            }
        }

        if (intArray->GetType() == scriptContext->GetLibrary()->GetNativeIntArrayType())
        {
            intArray->type = scriptContext->GetLibrary()->GetNativeFloatArrayType();
        }
        else
        {
            if (intArray->GetDynamicType()->GetIsLocked())
            {
                DynamicTypeHandler *typeHandler = intArray->GetDynamicType()->GetTypeHandler();
                if (typeHandler->IsPathTypeHandler())
                {
                    // We can't allow a type with the new type ID to be promoted to the old type.
                    // So go to a dictionary type handler, which will orphan the new type.
                    // This should be a corner case, so the inability to share the new type is unlikely to matter.
                    // If it does matter, try building a path from the new type's built-in root.
                    static_cast<PathTypeHandlerBase*>(typeHandler)->ResetTypeHandler(intArray);
                }
                else
                {
                    intArray->ChangeType();
                }
            }
            intArray->GetType()->SetTypeId(TypeIds_NativeFloatArray);
        }

        if (CrossSite::IsCrossSiteObjectTyped(intArray))
        {
            Assert(VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray));
            VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::SetVirtualTable(intArray);
        }
        else
        {
            Assert(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray));
            VirtualTableInfo<JavascriptNativeFloatArray>::SetVirtualTable(intArray);
        }

        failFastError.Completed();
        return (JavascriptNativeFloatArray*)intArray;
        JIT_HELPER_END(IntArr_ToNativeFloatArray);
    }